

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O3

void __thiscall JUnitTestOutput::writeFileEnding(JUnitTestOutput *this)

{
  SimpleString local_20;
  
  SimpleString::SimpleString(&local_20,"<system-out>");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  (*(this->super_TestOutput)._vptr_TestOutput[0x20])(&local_20,this,&this->impl_->stdOutput_);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_20,"</system-out>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_20,"<system-err></system-err>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_20,"</testsuite>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

void JUnitTestOutput::writeFileEnding()
{
    writeToFile("<system-out>");
    writeToFile(encodeXmlText(impl_->stdOutput_));
    writeToFile("</system-out>\n");
    writeToFile("<system-err></system-err>\n");
    writeToFile("</testsuite>\n");
}